

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zx7.h
# Opt level: O0

Optimal * optimize(uchar *input_data,size_t input_size)

{
  size_t sVar1;
  uint uVar2;
  int offset_00;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *__ptr;
  Optimal *pOVar7;
  ulong uVar8;
  ulong local_70;
  size_t i;
  size_t bits;
  size_t best_len;
  size_t len;
  int offset;
  int match_index;
  Match *match;
  Optimal *optimal;
  Match *match_slots;
  Match *matches;
  size_t *max;
  size_t *min;
  size_t input_size_local;
  uchar *input_data_local;
  
  pvVar4 = calloc(0x881,8);
  pvVar5 = calloc(0x881,8);
  pvVar6 = calloc(0x10000,0x10);
  __ptr = calloc(input_size,0x10);
  pOVar7 = (Optimal *)calloc(input_size,0x10);
  if ((((pvVar4 == (void *)0x0) || (pvVar5 == (void *)0x0)) || (pvVar6 == (void *)0x0)) ||
     ((__ptr == (void *)0x0 || (pOVar7 == (Optimal *)0x0)))) {
    fprintf(_stderr,"Error: Insufficient memory\n");
    exit(1);
  }
  pOVar7->bits = 8;
  local_70 = 1;
  do {
    if (input_size <= local_70) {
      free(__ptr);
      return pOVar7;
    }
    pOVar7[local_70].bits = pOVar7[local_70 - 1].bits + 9;
    uVar2 = (uint)CONCAT11(input_data[local_70 - 1],input_data[local_70]);
    bits = 1;
    for (_offset = (void *)((long)pvVar6 + (long)(int)uVar2 * 0x10);
        *(long *)((long)_offset + 8) != 0 && bits < 0x10000; _offset = *(void **)((long)_offset + 8)
        ) {
      offset_00 = (int)local_70 - (int)**(undefined8 **)((long)_offset + 8);
      if (0x880 < offset_00) {
        *(undefined8 *)((long)_offset + 8) = 0;
        break;
      }
      for (best_len = 2; best_len < 0x10001; best_len = best_len + 1) {
        if (bits < best_len) {
          bits = best_len;
          sVar1 = pOVar7[local_70 - best_len].bits;
          iVar3 = count_bits(offset_00,(int)best_len);
          uVar8 = sVar1 + (long)iVar3;
          if (uVar8 < pOVar7[local_70].bits) {
            pOVar7[local_70].bits = uVar8;
            pOVar7[local_70].offset = offset_00;
            pOVar7[local_70].len = (int)best_len;
          }
        }
        else if (((local_70 + 1 == *(long *)((long)pvVar5 + (long)offset_00 * 8) + best_len) &&
                 (*(long *)((long)pvVar5 + (long)offset_00 * 8) != 0)) &&
                (best_len = local_70 - *(long *)((long)pvVar4 + (long)offset_00 * 8),
                bits < best_len)) {
          best_len = bits;
        }
        if ((local_70 < (long)offset_00 + best_len) ||
           (input_data[local_70 - best_len] != input_data[(local_70 - best_len) - (long)offset_00]))
        break;
      }
      *(ulong *)((long)pvVar4 + (long)offset_00 * 8) = (local_70 + 1) - best_len;
      *(ulong *)((long)pvVar5 + (long)offset_00 * 8) = local_70;
    }
    *(ulong *)((long)__ptr + local_70 * 0x10) = local_70;
    *(undefined8 *)((long)__ptr + local_70 * 0x10 + 8) =
         *(undefined8 *)((long)pvVar6 + (long)(int)uVar2 * 0x10 + 8);
    *(void **)((long)pvVar6 + (long)(int)uVar2 * 0x10 + 8) = (void *)((long)__ptr + local_70 * 0x10)
    ;
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

Optimal* optimize(unsigned char *input_data, size_t input_size) {
    size_t *min;
    size_t *max;
    Match *matches;
    Match *match_slots;
    Optimal *optimal;
    Match *match;
    int match_index;
    int offset;
    size_t len;
    size_t best_len;
    size_t bits;
    size_t i;

    /* allocate all data structures at once */
    min = (size_t *)calloc(ZX7_MAX_OFFSET+1, sizeof(size_t));
    max = (size_t *)calloc(ZX7_MAX_OFFSET+1, sizeof(size_t));
    matches = (Match *)calloc(256*256, sizeof(Match));
    match_slots = (Match *)calloc(input_size, sizeof(Match));
    optimal = (Optimal *)calloc(input_size, sizeof(Optimal));

    if (!min || !max || !matches || !match_slots || !optimal) {
         fprintf(stderr, "Error: Insufficient memory\n");
         exit(1);
    }

    /* first byte is always literal */
    optimal[0].bits = 8;

    /* process remaining bytes */
    for (i = 1; i < input_size; i++) {

        optimal[i].bits = optimal[i-1].bits + 9;
        match_index = input_data[i-1] << 8 | input_data[i];
        best_len = 1;
        for (match = &matches[match_index]; match->next != NULL && best_len < ZX7_MAX_LEN; match = match->next) {
            offset = i - match->next->index;
            if (offset > ZX7_MAX_OFFSET) {
                match->next = NULL;
                break;
            }

            for (len = 2; len <= ZX7_MAX_LEN; len++) {
                if (len > best_len) {
                    best_len = len;
                    bits = optimal[i-len].bits + count_bits(offset, len);
                    if (optimal[i].bits > bits) {
                        optimal[i].bits = bits;
                        optimal[i].offset = offset;
                        optimal[i].len = len;
                    }
                } else if (i+1 == max[offset]+len && max[offset] != 0) {
                    len = i-min[offset];
                    if (len > best_len) {
                        len = best_len;
                    }
                }
                if (i < offset+len || input_data[i-len] != input_data[i-len-offset]) {
                    break;
                }
            }
            min[offset] = i+1-len;
            max[offset] = i;
        }
        match_slots[i].index = i;
        match_slots[i].next = matches[match_index].next;
        matches[match_index].next = &match_slots[i];
    }

    /* save time by releasing the largest block only, the O.S. will clean everything else later */
    free(match_slots);

    return optimal;
}